

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O1

void sha1_Final(SHA1_CTX *context,sha2_byte *digest)

{
  uint32_t *data;
  undefined8 uVar1;
  int j;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  if (digest != (sha2_byte *)0x0) {
    uVar4 = (uint)context->bitcount >> 3 & 0x3f;
    data = context->buffer;
    uVar2 = uVar4 + 1;
    *(undefined1 *)((long)context->buffer + (ulong)uVar4) = 0x80;
    if (0x37 < uVar4) {
      memzero((void *)((ulong)uVar2 + (long)data),(ulong)(uVar4 ^ 0x3f));
      lVar3 = 8;
      do {
        uVar2 = context->state[lVar3];
        context->state[lVar3] =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x18);
      sha1_Transform(context->state,data,context->state);
      uVar2 = 0;
    }
    memzero((void *)((ulong)uVar2 + (long)data),(ulong)(0x38 - uVar2));
    lVar3 = 8;
    do {
      uVar2 = context->state[lVar3];
      context->state[lVar3] =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x16);
    *(uint64_t *)(context->buffer + 0xe) = context->bitcount >> 0x20 | context->bitcount << 0x20;
    sha1_Transform(context->state,data,context->state);
    lVar3 = 0;
    do {
      uVar2 = context->state[lVar3];
      context->state[lVar3] =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    *(uint32_t *)(digest + 0x10) = context->state[4];
    uVar1 = *(undefined8 *)(context->state + 2);
    *(undefined8 *)digest = *(undefined8 *)context->state;
    *(undefined8 *)(digest + 8) = uVar1;
  }
  memzero(context,0x60);
  return;
}

Assistant:

void sha1_Final(trezor::SHA1_CTX* context, sha2_byte digest[]) {
	unsigned int	usedspace;

	/* If no digest buffer is passed, we don't bother doing this: */
	if (digest != (sha2_byte*)0) {
		usedspace = (context->bitcount >> 3) % SHA1_BLOCK_LENGTH;
		/* Begin padding with a 1 bit: */
		((uint8_t*)context->buffer)[usedspace++] = 0x80;

		if (usedspace > SHA1_SHORT_BLOCK_LENGTH) {
			memzero(((uint8_t*)context->buffer) + usedspace, SHA1_BLOCK_LENGTH - usedspace);

#if BYTE_ORDER == LITTLE_ENDIAN
			/* Convert TO host byte order */
			for (int j = 0; j < 16; j++) {
				REVERSE32(context->buffer[j],context->buffer[j]);
			}
#endif
			/* Do second-to-last transform: */
			sha1_Transform(context->state, context->buffer, context->state);

			/* And prepare the last transform: */
			usedspace = 0;
		}
		/* Set-up for the last transform: */
		memzero(((uint8_t*)context->buffer) + usedspace, SHA1_SHORT_BLOCK_LENGTH - usedspace);

#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert TO host byte order */
		for (int j = 0; j < 14; j++) {
			REVERSE32(context->buffer[j],context->buffer[j]);
		}
#endif
		/* Set the bit count: */
		context->buffer[14] = context->bitcount >> 32;
		context->buffer[15] = context->bitcount & 0xffffffff;

		/* Final transform: */
		sha1_Transform(context->state, context->buffer, context->state);

#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert FROM host byte order */
		for (int j = 0; j < 5; j++) {
			REVERSE32(context->state[j],context->state[j]);
		}
#endif
		MEMCPY_BCOPY(digest, context->state, SHA1_DIGEST_LENGTH);
	}

	/* Clean up state data: */
	memzero(context, sizeof(trezor::SHA1_CTX));
}